

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O0

int uv_fs_event_stop(uv_fs_event_t *handle)

{
  watcher_list *__ptr;
  long in_RDI;
  watcher_list *w;
  watcher_root *in_stack_00000010;
  int in_stack_0000002c;
  uv_loop_t *in_stack_00000030;
  int local_4;
  
  if ((*(uint *)(in_RDI + 0x30) & 0x4000) == 0) {
    local_4 = -0x16;
  }
  else {
    __ptr = find_watcher(in_stack_00000030,in_stack_0000002c);
    if (__ptr == (watcher_list *)0x0) {
      __assert_fail("w != NULL","src/unix/linux-inotify.c",0xed,
                    "int uv_fs_event_stop(uv_fs_event_t *)");
    }
    *(undefined4 *)(in_RDI + 0x60) = 0xffffffff;
    *(undefined8 *)(in_RDI + 0x40) = 0;
    if (((*(uint *)(in_RDI + 0x30) & 0x4000) != 0) &&
       (*(uint *)(in_RDI + 0x30) = *(uint *)(in_RDI + 0x30) & 0xffffbfff,
       (*(uint *)(in_RDI + 0x30) & 0x2000) != 0)) {
      *(int *)(*(long *)(in_RDI + 0x10) + 8) = *(int *)(*(long *)(in_RDI + 0x10) + 8) + -1;
    }
    **(undefined8 **)(in_RDI + 0x58) = *(undefined8 *)(in_RDI + 0x50);
    *(undefined8 *)(*(long *)(in_RDI + 0x50) + 8) = *(undefined8 *)(in_RDI + 0x58);
    if (__ptr->watchers == (void **)__ptr->watchers[0]) {
      watcher_root_RB_REMOVE(in_stack_00000010,(watcher_list *)handle);
      uv__inotify_rm_watch(0,0x120066);
      free(__ptr);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int uv_fs_event_stop(uv_fs_event_t* handle) {
  struct watcher_list* w;

  if (!uv__is_active(handle))
    return -EINVAL;

  w = find_watcher(handle->loop, handle->wd);
  assert(w != NULL);

  handle->wd = -1;
  handle->filename = NULL;
  uv__handle_stop(handle);
  QUEUE_REMOVE(&handle->watchers);

  if (QUEUE_EMPTY(&w->watchers)) {
    /* No watchers left for this path. Clean up. */
    RB_REMOVE(watcher_root, CAST(&handle->loop->inotify_watchers), w);
    uv__inotify_rm_watch(handle->loop->inotify_fd, w->wd);
    free(w);
  }

  return 0;
}